

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

void __thiscall Assimp::FBX::LineGeometry::~LineGeometry(LineGeometry *this)

{
  pointer piVar1;
  pointer paVar2;
  
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__LineGeometry_008ce890;
  piVar1 = (this->m_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_indices).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  paVar2 = (this->m_vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2,(long)(this->m_vertices).
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar2);
  }
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

LineGeometry::~LineGeometry() {
    // empty
}